

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlmder1c.c
# Opt level: O0

int main(void)

{
  char *pcVar1;
  double __x;
  fcndata_t data;
  double y [15];
  int n;
  int m;
  double wa [30];
  double fjac [45];
  double fvec [15];
  double x [3];
  double fnorm;
  double tol;
  int ipvt [3];
  int lwa;
  int info;
  int ldfjac;
  int j;
  undefined1 local_3b8 [32];
  double *in_stack_fffffffffffffc68;
  int in_stack_fffffffffffffc74;
  double in_stack_fffffffffffffcd0;
  double *in_stack_fffffffffffffcd8;
  double *in_stack_fffffffffffffce0;
  int in_stack_fffffffffffffce8;
  int in_stack_fffffffffffffcec;
  void *in_stack_fffffffffffffcf0;
  cminpack_funcder_mn in_stack_fffffffffffffcf8;
  double *in_stack_fffffffffffffd40;
  int in_stack_fffffffffffffd48;
  int *in_stack_fffffffffffffd50;
  double *in_stack_fffffffffffffd58;
  int in_stack_fffffffffffffd60;
  double local_58 [4];
  double local_38;
  undefined4 local_24;
  uint local_20;
  undefined4 local_1c;
  int local_18;
  undefined4 local_14;
  
  local_14 = 0;
  memcpy(local_3b8,&DAT_00105020,0x78);
  local_58[0] = 1.0;
  local_58[1] = 1.0;
  local_58[2] = 1.0;
  local_1c = 0xf;
  local_24 = 0x1e;
  __x = dpmpar(1);
  local_38 = sqrt(__x);
  local_20 = lmder1(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec,
                    in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                    in_stack_fffffffffffffd40,in_stack_fffffffffffffd48,in_stack_fffffffffffffcd0,
                    in_stack_fffffffffffffd50,in_stack_fffffffffffffd58,in_stack_fffffffffffffd60);
  local_58[3] = enorm(in_stack_fffffffffffffc74,in_stack_fffffffffffffc68);
  printf("      final l2 norm of the residuals%15.7g\n\n",local_58[3]);
  printf("      exit parameter                %10i\n\n",(ulong)local_20);
  printf("      final approximate solution\n");
  for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
    pcVar1 = "";
    if (local_18 % 3 == 0) {
      pcVar1 = "\n     ";
    }
    printf("%s%15.7g",local_58[local_18],pcVar1);
  }
  printf("\n");
  return 0;
}

Assistant:

int main()
{
  int j, ldfjac, info, lwa;
  int ipvt[3];
  real tol, fnorm;
  real x[3], fvec[15], fjac[15*3], wa[30];
  const int m = 15;
  const int n = 3;
  /* auxiliary data (e.g. measurements) */
  real y[15] = {1.4e-1, 1.8e-1, 2.2e-1, 2.5e-1, 2.9e-1, 3.2e-1, 3.5e-1,
                  3.9e-1, 3.7e-1, 5.8e-1, 7.3e-1, 9.6e-1, 1.34, 2.1, 4.39};
  fcndata_t data;
  data.m = m;
  data.y = y;

/*      the following starting values provide a rough fit. */

  x[0] = 1.;
  x[1] = 1.;
  x[2] = 1.;

  ldfjac = 15;
  lwa = 30;

/*      set tol to the square root of the machine precision. */
/*      unless high solutions are required, */
/*      this is the recommended setting. */

  tol = sqrt(__cminpack_func__(dpmpar)(1));

  info = __cminpack_func__(lmder1)(fcn, &data, m, n, x, fvec, fjac, ldfjac, tol, 
	  ipvt, wa, lwa);
  fnorm = __cminpack_func__(enorm)(m, fvec);
  printf("      final l2 norm of the residuals%15.7g\n\n", (double)fnorm);
  printf("      exit parameter                %10i\n\n", info);
  printf("      final approximate solution\n");
  for (j=0; j<n; ++j) {
    printf("%s%15.7g", j%3==0?"\n     ":"", (double)x[j]);
  }
  printf("\n");

  return 0;
}